

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall asl::Array<asl::InetAddress>::alloc(Array<asl::InetAddress> *this,int m)

{
  int *piVar1;
  undefined8 *puVar2;
  ulong uVar3;
  InetAddress *this_00;
  
  uVar3 = 3;
  if (3 < m) {
    uVar3 = (ulong)(uint)m;
  }
  piVar1 = (int *)malloc(uVar3 * 0x10 + 0x10);
  if (piVar1 != (int *)0x0) {
    this_00 = (InetAddress *)(piVar1 + 4);
    this->_a = this_00;
    piVar1[1] = (int)uVar3;
    *piVar1 = m;
    piVar1[2] = 1;
    if (m != 0) {
      do {
        Array<unsigned_char>::alloc(&this_00->_data,0);
        this_00->_type = IPv4;
        this_00 = this_00 + 1;
      } while (this_00 != (InetAddress *)(piVar1 + (long)m * 4 + 4));
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = dup2;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void Array<T>::alloc(int m)
{
	int s=max(m, 3);
	char* p = (char*) malloc( s*sizeof(T)+sizeof(Data) );
	if(!p)
		ASL_BAD_ALLOC();
	_a = (T*) ( p + sizeof(Data) );
	ASL_RC_INIT();
	d().s = s;
	d().n = m;
	d().rc=1;
	asl_construct(_a, m);
}